

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateTimeEdit::initStyleOption(QDateTimeEdit *this,QStyleOptionSpinBox *option)

{
  long lVar1;
  bool bVar2;
  QFlags<QStyle::SubControl> QVar3;
  QDateTimeEditPrivate *option_00;
  QDateTimeEditPrivate *in_RSI;
  QFlags<QStyle::SubControl> *in_RDI;
  long in_FS_OFFSET;
  QDateTimeEditPrivate *d;
  SubControl in_stack_ffffffffffffffcc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != (QDateTimeEditPrivate *)0x0) {
    option_00 = d_func((QDateTimeEdit *)0x561c21);
    QAbstractSpinBox::initStyleOption((QAbstractSpinBox *)in_RSI,(QStyleOptionSpinBox *)option_00);
    bVar2 = QDateTimeEditPrivate::calendarPopupEnabled(in_RSI);
    if (bVar2) {
      ::operator|((enum_type)((ulong)in_RDI >> 0x20),(enum_type)in_RDI);
      QVar3 = QFlags<QStyle::SubControl>::operator|(in_RDI,in_stack_ffffffffffffffcc);
      *(QFlagsStorageHelper<QStyle::SubControl,_4> *)
       &(in_RSI->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate.field_0x40 =
           QVar3.super_QFlagsStorageHelper<QStyle::SubControl,_4>.
           super_QFlagsStorage<QStyle::SubControl>.i;
      if (option_00->arrowState == State_Sunken) {
        QFlags<QStyle::StateFlag>::operator|=
                  ((QFlags<QStyle::StateFlag> *)
                   &(in_RSI->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate.field_0x8,
                   State_Sunken);
      }
      else {
        QFlags<QStyle::StateFlag>::operator&=
                  ((QFlags<QStyle::StateFlag> *)
                   &(in_RSI->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate.field_0x8,-5);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTimeEdit::initStyleOption(QStyleOptionSpinBox *option) const
{
    if (!option)
        return;

    Q_D(const QDateTimeEdit);
    QAbstractSpinBox::initStyleOption(option);
    if (d->calendarPopupEnabled()) {
        option->subControls = QStyle::SC_ComboBoxFrame | QStyle::SC_ComboBoxEditField
                              | QStyle::SC_ComboBoxArrow;
        if (d->arrowState == QStyle::State_Sunken)
            option->state |= QStyle::State_Sunken;
        else
            option->state &= ~QStyle::State_Sunken;
    }
}